

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint64_t farmhash_cc_len_0_to_16(char *s,size_t len)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t mul_00;
  uint64_t uVar3;
  uint64_t val;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong in_RSI;
  byte *in_RDI;
  uint32_t z;
  uint32_t y;
  uint8_t c_1;
  uint8_t b_1;
  uint8_t a_2;
  uint64_t a_1;
  uint64_t mul_1;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t mul;
  uint64_t local_8;
  
  if (in_RSI < 8) {
    if (in_RSI < 4) {
      if (in_RSI == 0) {
        local_8 = 0x9ae16a3b2f90404f;
      }
      else {
        local_8 = smix((ulong)((uint)*in_RDI + (uint)in_RDI[in_RSI >> 1] * 0x100) *
                       -0x651e95c4d06fbfb1 ^
                       (ulong)((int)in_RSI + (uint)in_RDI[in_RSI - 1] * 4) * -0x3c5a37a36834ced9);
        local_8 = local_8 * -0x651e95c4d06fbfb1;
      }
    }
    else {
      uVar1 = fetch32((char *)in_RDI);
      uVar2 = fetch32((char *)(in_RDI + (in_RSI - 4)));
      local_8 = farmhash_len_16_mul(in_RSI + (ulong)uVar1 * 8,(ulong)uVar2,
                                    in_RSI * 2 + 0x9ae16a3b2f90404f);
    }
  }
  else {
    mul_00 = in_RSI * 2 + 0x9ae16a3b2f90404f;
    uVar3 = fetch64((char *)in_RDI);
    val = fetch64((char *)(in_RDI + (in_RSI - 8)));
    uVar4 = ror64(val,0x25);
    uVar5 = ror64(uVar3 + 0x9ae16a3b2f90404f,0x19);
    local_8 = farmhash_len_16_mul(uVar4 * mul_00 + uVar3 + 0x9ae16a3b2f90404f,(uVar5 + val) * mul_00
                                  ,mul_00);
  }
  return local_8;
}

Assistant:

static inline uint64_t farmhash_cc_len_0_to_16(const char *s, size_t len) {
  if (len >= 8) {
    uint64_t mul = k2 + len * 2;
    uint64_t a = fetch64(s) + k2;
    uint64_t b = fetch64(s + len - 8);
    uint64_t c = ror64(b, 37) * mul + a;
    uint64_t d = (ror64(a, 25) + b) * mul;
    return farmhash_len_16_mul(c, d, mul);
  }
  if (len >= 4) {
    uint64_t mul = k2 + len * 2;
    uint64_t a = fetch32(s);
    return farmhash_len_16_mul(len + (a << 3), fetch32(s + len - 4), mul);
  }
  if (len > 0) {
    uint8_t a = s[0];
    uint8_t b = s[len >> 1];
    uint8_t c = s[len - 1];
    uint32_t y = ((uint32_t) a) + (((uint32_t) b) << 8);
    uint32_t z = len + (((uint32_t) c) << 2);
    return smix(y * k2 ^ z * k0) * k2;
  }
  return k2;
}